

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O2

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::populateFollowing(BreakCache *this)

{
  ushort uVar1;
  RuleBasedBreakIterator *pRVar2;
  UBool UVar3;
  int32_t iVar4;
  int iVar5;
  bool bVar6;
  int32_t ruleStatusIdx;
  int32_t local_24;
  
  iVar4 = this->fBoundaries[this->fEndBufIdx];
  uVar1 = this->fStatuses[this->fEndBufIdx];
  ruleStatusIdx = 0;
  local_24 = 0;
  UVar3 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar4,&local_24,&ruleStatusIdx);
  if (UVar3 == '\0') {
    pRVar2 = this->fBI;
    pRVar2->fPosition = iVar4;
    local_24 = handleNext(pRVar2);
    if (local_24 == -1) {
      return '\0';
    }
    pRVar2 = this->fBI;
    ruleStatusIdx = pRVar2->fRuleStatusIndex;
    if (pRVar2->fDictionaryCharCount != 0) {
      DictionaryCache::populateDictionary
                (pRVar2->fDictionaryCache,iVar4,local_24,(uint)uVar1,ruleStatusIdx);
      UVar3 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar4,&local_24,&ruleStatusIdx)
      ;
      if (UVar3 != '\0') goto LAB_00290c36;
    }
    addFollowing(this,local_24,ruleStatusIdx,UpdateCachePosition);
    iVar5 = 6;
    while (((bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6 &&
            (iVar4 = handleNext(this->fBI), iVar4 != -1)) && (this->fBI->fDictionaryCharCount == 0))
          ) {
      addFollowing(this,iVar4,this->fBI->fRuleStatusIndex,RetainCachePosition);
    }
  }
  else {
LAB_00290c36:
    addFollowing(this,local_24,ruleStatusIdx,UpdateCachePosition);
  }
  return '\x01';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populateFollowing() {
    int32_t fromPosition = fBoundaries[fEndBufIdx];
    int32_t fromRuleStatusIdx = fStatuses[fEndBufIdx];
    int32_t pos = 0;
    int32_t ruleStatusIdx = 0;

    if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
        addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
        return TRUE;
    }

    fBI->fPosition = fromPosition;
    pos = fBI->handleNext();
    if (pos == UBRK_DONE) {
        return FALSE;
    }

    ruleStatusIdx = fBI->fRuleStatusIndex;
    if (fBI->fDictionaryCharCount > 0) {
        // The text segment obtained from the rules includes dictionary characters.
        // Subdivide it, with subdivided results going into the dictionary cache.
        fBI->fDictionaryCache->populateDictionary(fromPosition, pos, fromRuleStatusIdx, ruleStatusIdx);
        if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
            addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
            return TRUE;
            // TODO: may want to move a sizable chunk of dictionary cache to break cache at this point.
            //       But be careful with interactions with populateNear().
        }
    }

    // Rule based segment did not include dictionary characters.
    // Or, it did contain dictionary chars, but the dictionary segmenter didn't handle them,
    //    meaning that we didn't take the return, above.
    // Add its end point to the cache.
    addFollowing(pos, ruleStatusIdx, UpdateCachePosition);

    // Add several non-dictionary boundaries at this point, to optimize straight forward iteration.
    //    (subsequent calls to BreakIterator::next() will take the fast path, getting cached results.
    //
    for (int count=0; count<6; ++count) {
        pos = fBI->handleNext();
        if (pos == UBRK_DONE || fBI->fDictionaryCharCount > 0) {
            break;
        }
        addFollowing(pos, fBI->fRuleStatusIndex, RetainCachePosition);
    }

    return TRUE;
}